

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_with_normal_and_texture.c
# Opt level: O0

bool_t prf_vertex_with_normal_and_texture_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  ushort uVar1;
  ushort *in_RDI;
  bfile_t *unaff_retaddr;
  node_data_conflict15 *data;
  int pos;
  undefined4 in_stack_ffffffffffffffc8;
  undefined2 in_stack_ffffffffffffffcc;
  uint16_t in_stack_ffffffffffffffce;
  bfile_t *in_stack_ffffffffffffffd0;
  bfile_t *bfile_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  bool_t bVar2;
  
  if (*in_RDI == prf_vertex_with_normal_and_texture_info.opcode) {
    bf_put_uint16_be(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffce);
    bf_put_uint16_be(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffce);
    bfile_00 = *(bfile_t **)(in_RDI + 4);
    bf_put_uint16_be(bfile_00,in_stack_ffffffffffffffce);
    bf_put_uint16_be(bfile_00,in_stack_ffffffffffffffce);
    bf_put_float64_be(bfile_00,(float64_t)
                               CONCAT26(in_stack_ffffffffffffffce,
                                        CONCAT24(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8
                                                )));
    bf_put_float64_be(bfile_00,(float64_t)
                               CONCAT26(in_stack_ffffffffffffffce,
                                        CONCAT24(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8
                                                )));
    bf_put_float64_be(bfile_00,(float64_t)
                               CONCAT26(in_stack_ffffffffffffffce,
                                        CONCAT24(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8
                                                )));
    uVar1 = 0x20;
    if (0x23 < in_RDI[1]) {
      bf_put_float32_be(bfile_00,(float32_t)
                                 CONCAT22(in_stack_ffffffffffffffce,in_stack_ffffffffffffffcc));
      uVar1 = 0x24;
      if (0x27 < in_RDI[1]) {
        bf_put_float32_be(bfile_00,(float32_t)
                                   CONCAT22(in_stack_ffffffffffffffce,in_stack_ffffffffffffffcc));
        uVar1 = 0x28;
        if (0x2b < in_RDI[1]) {
          bf_put_float32_be(bfile_00,(float32_t)
                                     CONCAT22(in_stack_ffffffffffffffce,in_stack_ffffffffffffffcc));
          uVar1 = 0x2c;
          if (0x2f < in_RDI[1]) {
            bf_put_float32_be(bfile_00,(float32_t)
                                       CONCAT22(in_stack_ffffffffffffffce,in_stack_ffffffffffffffcc)
                             );
            uVar1 = 0x30;
            if (0x33 < in_RDI[1]) {
              bf_put_float32_be(bfile_00,(float32_t)
                                         CONCAT22(in_stack_ffffffffffffffce,
                                                  in_stack_ffffffffffffffcc));
              uVar1 = 0x34;
              if (0x37 < in_RDI[1]) {
                bf_put_uint32_be(bfile_00,CONCAT22(in_stack_ffffffffffffffce,
                                                   in_stack_ffffffffffffffcc));
                uVar1 = 0x38;
                if (0x3b < in_RDI[1]) {
                  bf_put_uint32_be(bfile_00,CONCAT22(in_stack_ffffffffffffffce,
                                                     in_stack_ffffffffffffffcc));
                  uVar1 = 0x3c;
                }
              }
            }
          }
        }
      }
    }
    if (uVar1 < in_RDI[1]) {
      bf_write(unaff_retaddr,
               (uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
               (uint)((ulong)in_RDI >> 0x20));
    }
    bVar2 = 1;
  }
  else {
    prf_error(9,"tried vertex with normal and texture save method on node of type %d.",
              (ulong)*in_RDI);
    bVar2 = 0;
  }
  return bVar2;
}

Assistant:

static
bool_t
prf_vertex_with_normal_and_texture_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && state != NULL && bfile != NULL );

    if ( node->opcode != prf_vertex_with_normal_and_texture_info.opcode ) {
        prf_error( 9,
        "tried vertex with normal and texture save method on node of type %d.",
            node->opcode );
        return FALSE;
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    pos = 4;
    do {
        node_data * data;
        data = (node_data *) node->data;
        assert( data != NULL );
        bf_put_uint16_be( bfile, data->color_name_index ); pos += 2;
        bf_put_uint16_be( bfile, data->flags ); pos += 2;
        bf_put_float64_be( bfile, prf_dblread( data->x ) ); pos += 8;
        bf_put_float64_be( bfile, prf_dblread( data->y ) ); pos += 8;
        bf_put_float64_be( bfile, prf_dblread( data->z ) ); pos += 8;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->normal[0] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->normal[1] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->normal[2] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->texture[0] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->texture[1] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->packed_color ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->color_index ); pos += 4;
    } while ( FALSE );

    if ( node->length > pos )
        pos += bf_write( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}